

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O1

void __thiscall sf::Shape::Shape(Shape *this)

{
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_0027b310;
  Transformable::Transformable(&this->super_Transformable);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Shape_0027e558;
  (this->super_Transformable)._vptr_Transformable = (_func_int **)&PTR__Shape_0027e590;
  this->m_texture = (Texture *)0x0;
  (this->m_textureRect).left = 0;
  (this->m_textureRect).top = 0;
  (this->m_textureRect).width = 0;
  (this->m_textureRect).height = 0;
  Color::Color(&this->m_fillColor,0xff,0xff,0xff,0xff);
  Color::Color(&this->m_outlineColor,0xff,0xff,0xff,0xff);
  this->m_outlineThickness = 0.0;
  VertexArray::VertexArray(&this->m_vertices,TriangleFan,0);
  VertexArray::VertexArray(&this->m_outlineVertices,TriangleStrip,0);
  (this->m_bounds).left = 0.0;
  (this->m_bounds).top = 0.0;
  (this->m_bounds).width = 0.0;
  (this->m_bounds).height = 0.0;
  (this->m_insideBounds).left = 0.0;
  (this->m_insideBounds).top = 0.0;
  (this->m_insideBounds).width = 0.0;
  (this->m_insideBounds).height = 0.0;
  return;
}

Assistant:

Shape::Shape() :
m_texture         (NULL),
m_textureRect     (),
m_fillColor       (255, 255, 255),
m_outlineColor    (255, 255, 255),
m_outlineThickness(0),
m_vertices        (TriangleFan),
m_outlineVertices (TriangleStrip),
m_insideBounds    (),
m_bounds          ()
{
}